

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

int imagetopnm(opj_image_t *image,char *outfile,int force_split)

{
  OPJ_UINT32 OVar1;
  OPJ_INT32 *pOVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  FILE *pFVar6;
  undefined8 uVar7;
  opj_image_comp_t *poVar8;
  char *pcVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint *puVar17;
  uint *local_68;
  uint *local_60;
  int local_50;
  int local_4c;
  
  poVar8 = image->comps;
  OVar1 = poVar8->prec;
  uVar10 = 1;
  pcVar5 = outfile;
  if ((int)OVar1 < 0x11) {
    do {
      pcVar9 = pcVar5;
      pcVar5 = pcVar9 + 1;
    } while (*pcVar9 != '\0');
    uVar3 = image->numcomps;
    uVar13 = uVar3;
    if ((pcVar9[-2] & 0xdfU) == 0x47) {
      uVar13 = uVar10;
    }
    if ((force_split == 0) && (1 < uVar13)) {
      for (uVar10 = 1; uVar10 < uVar3; uVar10 = uVar10 + 1) {
        if (((poVar8->dx != poVar8[uVar10].dx) || (poVar8->dy != poVar8[uVar10].dy)) ||
           ((uVar10 < 3 && ((OVar1 != poVar8[uVar10].prec || (poVar8->sgnd != poVar8[uVar10].sgnd)))
            ))) goto LAB_00108a40;
      }
      pFVar6 = fopen(outfile,"wb");
      if (pFVar6 == (FILE *)0x0) {
        fprintf(_stderr,"ERROR -> failed to open %s for writing\n",outfile);
        return 1;
      }
      poVar8 = image->comps;
      if (uVar13 < 3) {
        local_60 = (uint *)0x0;
        local_68 = (uint *)0x0;
      }
      else {
        local_68 = (uint *)poVar8[1].data;
        local_60 = (uint *)poVar8[2].data;
      }
      uVar10 = poVar8->w;
      uVar3 = poVar8->h;
      uVar12 = (ulong)(uint)~(-1 << ((byte)OVar1 & 0x1f));
      pOVar2 = poVar8->data;
      if ((uVar13 == 4) || (uVar13 == 2)) {
        pcVar5 = "GRAYSCALE_ALPHA";
        if (2 < uVar13) {
          pcVar5 = "RGB_ALPHA";
        }
        uVar7 = opj_version();
        iVar14 = 0;
        fprintf(pFVar6,
                "P7\n# OpenJPEG-%s\nWIDTH %d\nHEIGHT %d\nDEPTH %u\nMAXVAL %d\nTUPLTYPE %s\nENDHDR\n"
                ,uVar7,(ulong)uVar10,(ulong)uVar3,(ulong)uVar13,uVar12,pcVar5);
        poVar8 = image->comps;
        puVar17 = (uint *)poVar8[(ulong)uVar13 - 1].data;
        if (poVar8[(ulong)uVar13 - 1].sgnd != 0) {
          iVar14 = 1 << ((char)poVar8[(ulong)uVar13 - 1].prec - 1U & 0x1f);
        }
      }
      else {
        uVar7 = opj_version();
        iVar14 = 0;
        fprintf(pFVar6,"P6\n# OpenJPEG-%s\n%d %d\n%d\n",uVar7,(ulong)uVar10,(ulong)uVar3,uVar12);
        poVar8 = image->comps;
        puVar17 = (uint *)0x0;
      }
      local_4c = 0;
      iVar16 = 0;
      if (poVar8->sgnd != 0) {
        iVar16 = 1 << ((char)poVar8->prec - 1U & 0x1f);
      }
      local_50 = 0;
      if (2 < uVar13) {
        local_50 = 0;
        local_4c = 0;
        if (poVar8[1].sgnd != 0) {
          local_4c = 1 << ((char)poVar8[1].prec - 1U & 0x1f);
        }
        if (poVar8[2].sgnd != 0) {
          local_50 = 1 << ((char)poVar8[2].prec - 1U & 0x1f);
        }
      }
      iVar15 = uVar3 * uVar10;
      if ((int)(uVar3 * uVar10) < 1) {
        iVar15 = 0;
      }
      for (lVar11 = 0; iVar15 != (int)lVar11; lVar11 = lVar11 + 1) {
        uVar10 = pOVar2[lVar11];
        if ((int)OVar1 < 9) {
          uVar3 = 0;
          if (0 < (int)uVar10) {
            uVar3 = uVar10;
          }
          uVar3 = uVar3 & 0xff;
          if (0xff < (int)uVar10) {
            uVar3 = 0xff;
          }
          fputc(uVar3,pFVar6);
          if (2 < uVar13) {
            uVar10 = *local_68;
            local_68 = local_68 + 1;
            uVar3 = 0;
            if (0 < (int)uVar10) {
              uVar3 = uVar10;
            }
            uVar3 = uVar3 & 0xff;
            if (0xff < (int)uVar10) {
              uVar3 = 0xff;
            }
            fputc(uVar3,pFVar6);
            uVar10 = *local_60;
            local_60 = local_60 + 1;
            uVar3 = 0;
            if (0 < (int)uVar10) {
              uVar3 = uVar10;
            }
            uVar3 = uVar3 & 0xff;
            if (0xff < (int)uVar10) {
              uVar3 = 0xff;
            }
            fputc(uVar3,pFVar6);
          }
          if ((uVar13 == 4) || (uVar13 == 2)) {
            uVar10 = *puVar17;
            puVar17 = puVar17 + 1;
            uVar3 = 0;
            if (0 < (int)uVar10) {
              uVar3 = uVar10;
            }
            uVar3 = uVar3 & 0xff;
            if (0xff < (int)uVar10) {
              uVar3 = 0xff;
            }
            fputc(uVar3,pFVar6);
          }
        }
        else {
          uVar10 = uVar10 + iVar16;
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          if (0xfffe < (int)uVar10) {
            uVar10 = 0xffff;
          }
          fprintf(pFVar6,"%c%c",(ulong)(uVar10 >> 8));
          if (2 < uVar13) {
            uVar10 = *local_68 + local_4c;
            local_68 = local_68 + 1;
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            if (0xfffe < (int)uVar10) {
              uVar10 = 0xffff;
            }
            fprintf(pFVar6,"%c%c",(ulong)(uVar10 >> 8),(ulong)(uVar10 & 0xff));
            uVar10 = *local_60 + local_50;
            local_60 = local_60 + 1;
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            if (0xfffe < (int)uVar10) {
              uVar10 = 0xffff;
            }
            fprintf(pFVar6,"%c%c",(ulong)(uVar10 >> 8));
          }
          if ((uVar13 == 4) || (uVar13 == 2)) {
            uVar10 = *puVar17 + iVar14;
            puVar17 = puVar17 + 1;
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            uVar12 = (ulong)uVar10;
            if (0xfffe < (int)uVar10) {
              uVar12 = 0xffff;
            }
            fprintf(pFVar6,"%c%c",uVar12 >> 8);
          }
        }
      }
      fclose(pFVar6);
    }
    else {
LAB_00108a40:
      if (uVar13 < uVar3) {
        fwrite("WARNING -> [PGM file] Only the first component\n",0x2f,1,_stderr);
        fwrite("           is written to the file\n",0x22,1,_stderr);
      }
      sVar4 = strlen(outfile);
      pcVar5 = (char *)malloc(sVar4 + 8);
      if (pcVar5 == (char *)0x0) {
        fwrite("imagetopnm: memory out\n",0x17,1,_stderr);
        return 1;
      }
      for (uVar12 = 0; uVar12 != uVar13; uVar12 = uVar12 + 1) {
        if (uVar13 < 2) {
          strcpy(pcVar5,outfile);
        }
        else {
          sVar4 = strlen(outfile);
          strncpy(pcVar5,outfile,sVar4 - 4);
          sprintf(pcVar5 + (sVar4 - 4),"_%u.pgm",uVar12 & 0xffffffff);
        }
        pFVar6 = fopen(pcVar5,"wb");
        if (pFVar6 == (FILE *)0x0) {
          fprintf(_stderr,"ERROR -> failed to open %s for writing\n",pcVar5);
          free(pcVar5);
          return 1;
        }
        poVar8 = image->comps;
        uVar10 = poVar8[uVar12].w;
        uVar3 = poVar8[uVar12].h;
        OVar1 = poVar8[uVar12].prec;
        uVar7 = opj_version();
        fprintf(pFVar6,"P5\n#OpenJPEG-%s\n%d %d\n%d\n",uVar7,(ulong)uVar10,(ulong)uVar3,
                (ulong)(uint)~(-1 << ((byte)OVar1 & 0x1f)));
        poVar8 = image->comps;
        pOVar2 = poVar8[uVar12].data;
        if (pOVar2 != (OPJ_INT32 *)0x0) {
          if (poVar8[uVar12].sgnd == 0) {
            iVar14 = 0;
          }
          else {
            iVar14 = 1 << ((char)poVar8[uVar12].prec - 1U & 0x1f);
          }
          iVar16 = uVar3 * uVar10;
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          if ((int)OVar1 < 9) {
            for (lVar11 = 0; iVar16 != (int)lVar11; lVar11 = lVar11 + 1) {
              uVar3 = pOVar2[lVar11] + iVar14;
              uVar10 = 0;
              if (0 < (int)uVar3) {
                uVar10 = uVar3;
              }
              uVar10 = uVar10 & 0xff;
              if (0xff < (int)uVar3) {
                uVar10 = 0xff;
              }
              fputc(uVar10,pFVar6);
            }
          }
          else {
            for (lVar11 = 0; iVar16 != (int)lVar11; lVar11 = lVar11 + 1) {
              uVar10 = pOVar2[lVar11] + iVar14;
              if (pOVar2[lVar11] + iVar14 < 1) {
                uVar10 = 0;
              }
              if (0xfffe < (int)uVar10) {
                uVar10 = 0xffff;
              }
              fprintf(pFVar6,"%c%c",(ulong)(uVar10 >> 8),(ulong)uVar10 & 0xff);
            }
          }
        }
        fclose(pFVar6);
      }
      free(pcVar5);
    }
    uVar10 = 0;
  }
  else {
    fprintf(_stderr,"%s:%d:imagetopnm\n\tprecision %d is larger than 16\n\t: refused.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/bin/jp2/convert.c"
            ,0x7f4,OVar1);
  }
  return uVar10;
}

Assistant:

int imagetopnm(opj_image_t * image, const char *outfile, int force_split)
{
    int *red, *green, *blue, *alpha;
    int wr, hr, max;
    int i;
    unsigned int compno, ncomp;
    int adjustR, adjustG, adjustB, adjustA;
    int fails, two, want_gray, has_alpha, triple;
    int prec, v;
    FILE *fdest = NULL;
    const char *tmp = outfile;
    char *destname;

    alpha = NULL;

    if ((prec = (int)image->comps[0].prec) > 16) {
        fprintf(stderr, "%s:%d:imagetopnm\n\tprecision %d is larger than 16"
                "\n\t: refused.\n", __FILE__, __LINE__, prec);
        return 1;
    }
    two = has_alpha = 0;
    fails = 1;
    ncomp = image->numcomps;

    while (*tmp) {
        ++tmp;
    }
    tmp -= 2;
    want_gray = (*tmp == 'g' || *tmp == 'G');
    ncomp = image->numcomps;

    if (want_gray) {
        ncomp = 1;
    }

    if ((force_split == 0) && ncomp >= 2 &&
            are_comps_similar(image)) {
        fdest = fopen(outfile, "wb");

        if (!fdest) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", outfile);
            return fails;
        }
        two = (prec > 8);
        triple = (ncomp > 2);
        wr = (int)image->comps[0].w;
        hr = (int)image->comps[0].h;
        max = (1 << prec) - 1;
        has_alpha = (ncomp == 4 || ncomp == 2);

        red = image->comps[0].data;

        if (triple) {
            green = image->comps[1].data;
            blue = image->comps[2].data;
        } else {
            green = blue = NULL;
        }

        if (has_alpha) {
            const char *tt = (triple ? "RGB_ALPHA" : "GRAYSCALE_ALPHA");

            fprintf(fdest, "P7\n# OpenJPEG-%s\nWIDTH %d\nHEIGHT %d\nDEPTH %u\n"
                    "MAXVAL %d\nTUPLTYPE %s\nENDHDR\n", opj_version(),
                    wr, hr, ncomp, max, tt);
            alpha = image->comps[ncomp - 1].data;
            adjustA = (image->comps[ncomp - 1].sgnd ?
                       1 << (image->comps[ncomp - 1].prec - 1) : 0);
        } else {
            fprintf(fdest, "P6\n# OpenJPEG-%s\n%d %d\n%d\n",
                    opj_version(), wr, hr, max);
            adjustA = 0;
        }
        adjustR = (image->comps[0].sgnd ? 1 << (image->comps[0].prec - 1) : 0);

        if (triple) {
            adjustG = (image->comps[1].sgnd ? 1 << (image->comps[1].prec - 1) : 0);
            adjustB = (image->comps[2].sgnd ? 1 << (image->comps[2].prec - 1) : 0);
        } else {
            adjustG = adjustB = 0;
        }

        for (i = 0; i < wr * hr; ++i) {
            if (two) {
                v = *red + adjustR;
                ++red;
                if (v > 65535) {
                    v = 65535;
                } else if (v < 0) {
                    v = 0;
                }

                /* netpbm: */
                fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                if (triple) {
                    v = *green + adjustG;
                    ++green;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                    v =  *blue + adjustB;
                    ++blue;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                }/* if(triple) */

                if (has_alpha) {
                    v = *alpha + adjustA;
                    ++alpha;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);
                }
                continue;

            }   /* if(two) */

            /* prec <= 8: */
            v = *red++;
            if (v > 255) {
                v = 255;
            } else if (v < 0) {
                v = 0;
            }

            fprintf(fdest, "%c", (unsigned char)v);
            if (triple) {
                v = *green++;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
                v = *blue++;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
            }
            if (has_alpha) {
                v = *alpha++;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
            }
        }   /* for(i */

        fclose(fdest);
        return 0;
    }

    /* YUV or MONO: */

    if (image->numcomps > ncomp) {
        fprintf(stderr, "WARNING -> [PGM file] Only the first component\n");
        fprintf(stderr, "           is written to the file\n");
    }
    destname = (char*)malloc(strlen(outfile) + 8);
    if (destname == NULL) {
        fprintf(stderr, "imagetopnm: memory out\n");
        return 1;
    }
    for (compno = 0; compno < ncomp; compno++) {
        if (ncomp > 1) {
            /*sprintf(destname, "%d.%s", compno, outfile);*/
            const size_t olen = strlen(outfile);
            const size_t dotpos = olen - 4;

            strncpy(destname, outfile, dotpos);
            sprintf(destname + dotpos, "_%u.pgm", compno);
        } else {
            sprintf(destname, "%s", outfile);
        }

        fdest = fopen(destname, "wb");
        if (!fdest) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", destname);
            free(destname);
            return 1;
        }
        wr = (int)image->comps[compno].w;
        hr = (int)image->comps[compno].h;
        prec = (int)image->comps[compno].prec;
        max = (1 << prec) - 1;

        fprintf(fdest, "P5\n#OpenJPEG-%s\n%d %d\n%d\n",
                opj_version(), wr, hr, max);

        red = image->comps[compno].data;
        if (!red) {
            fclose(fdest);
            continue;
        }

        adjustR =
            (image->comps[compno].sgnd ? 1 << (image->comps[compno].prec - 1) : 0);

        if (prec > 8) {
            for (i = 0; i < wr * hr; i++) {
                v = *red + adjustR;
                ++red;
                if (v > 65535) {
                    v = 65535;
                } else if (v < 0) {
                    v = 0;
                }

                /* netpbm: */
                fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);

                if (has_alpha) {
                    v = *alpha++;
                    if (v > 65535) {
                        v = 65535;
                    } else if (v < 0) {
                        v = 0;
                    }

                    /* netpbm: */
                    fprintf(fdest, "%c%c", (unsigned char)(v >> 8), (unsigned char)v);
                }
            }/* for(i */
        } else { /* prec <= 8 */
            for (i = 0; i < wr * hr; ++i) {
                v = *red + adjustR;
                ++red;
                if (v > 255) {
                    v = 255;
                } else if (v < 0) {
                    v = 0;
                }

                fprintf(fdest, "%c", (unsigned char)v);
            }
        }
        fclose(fdest);
    } /* for (compno */
    free(destname);

    return 0;
}